

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

IXML_Attr * ixmlNode_cloneAttr(IXML_Attr *nodeptr)

{
  int iVar1;
  int rc;
  IXML_Node *srcNode;
  IXML_Node *attrNode;
  IXML_Attr *newAttr;
  IXML_Attr *nodeptr_local;
  
  if (nodeptr != (IXML_Attr *)0x0) {
    nodeptr_local = (IXML_Attr *)malloc(0x80);
    if (nodeptr_local == (IXML_Attr *)0x0) {
      nodeptr_local = (IXML_Attr *)0x0;
    }
    else {
      ixmlAttr_init(nodeptr_local);
      iVar1 = ixmlNode_setNodeName((IXML_Node *)nodeptr_local,(nodeptr->n).nodeName);
      if (iVar1 == 0) {
        iVar1 = ixmlNode_setNodeValue((IXML_Node *)nodeptr_local,(nodeptr->n).nodeValue);
        if (iVar1 == 0) {
          iVar1 = ixmlNode_setNamespaceURI((IXML_Node *)nodeptr_local,(nodeptr->n).namespaceURI);
          if (iVar1 == 0) {
            iVar1 = ixmlNode_setPrefix((IXML_Node *)nodeptr_local,(nodeptr->n).prefix);
            if (iVar1 == 0) {
              iVar1 = ixmlNode_setLocalName((IXML_Node *)nodeptr_local,(nodeptr->n).localName);
              if (iVar1 == 0) {
                (nodeptr_local->n).nodeType = eATTRIBUTE_NODE;
              }
              else {
                ixmlAttr_free(nodeptr_local);
                nodeptr_local = (IXML_Attr *)0x0;
              }
            }
            else {
              ixmlAttr_free(nodeptr_local);
              nodeptr_local = (IXML_Attr *)0x0;
            }
          }
          else {
            ixmlAttr_free(nodeptr_local);
            nodeptr_local = (IXML_Attr *)0x0;
          }
        }
        else {
          ixmlAttr_free(nodeptr_local);
          nodeptr_local = (IXML_Attr *)0x0;
        }
      }
      else {
        ixmlAttr_free(nodeptr_local);
        nodeptr_local = (IXML_Attr *)0x0;
      }
    }
    return nodeptr_local;
  }
  __assert_fail("nodeptr != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/node.c",
                0x367,"IXML_Attr *ixmlNode_cloneAttr(IXML_Attr *)");
}

Assistant:

static IXML_Attr *ixmlNode_cloneAttr(
	/*! [in] The \b Node to clone. */
	IXML_Attr *nodeptr)
{
	IXML_Attr *newAttr;
	IXML_Node *attrNode;
	IXML_Node *srcNode;
	int rc;

	assert(nodeptr != NULL);

	newAttr = (IXML_Attr *)malloc(sizeof(IXML_Attr));
	if (newAttr == NULL) {
		return NULL;
	}

	ixmlAttr_init(newAttr);
	attrNode = (IXML_Node *)newAttr;
	srcNode = (IXML_Node *)nodeptr;

	rc = ixmlNode_setNodeName(attrNode, srcNode->nodeName);
	if (rc != IXML_SUCCESS) {
		ixmlAttr_free(newAttr);
		return NULL;
	}

	rc = ixmlNode_setNodeValue(attrNode, srcNode->nodeValue);
	if (rc != IXML_SUCCESS) {
		ixmlAttr_free(newAttr);
		return NULL;
	}

	/* Check to see whether we need to split prefix and localname for
	 * attribute */
	rc = ixmlNode_setNamespaceURI(attrNode, srcNode->namespaceURI);
	if (rc != IXML_SUCCESS) {
		ixmlAttr_free(newAttr);
		return NULL;
	}

	rc = ixmlNode_setPrefix(attrNode, srcNode->prefix);
	if (rc != IXML_SUCCESS) {
		ixmlAttr_free(newAttr);
		return NULL;
	}

	rc = ixmlNode_setLocalName(attrNode, srcNode->localName);
	if (rc != IXML_SUCCESS) {
		ixmlAttr_free(newAttr);
		return NULL;
	}

	attrNode->nodeType = eATTRIBUTE_NODE;

	return newAttr;
}